

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O2

int chrono::collision::GetIndex
              (ChVector<double> *vertex,
              vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              *vertexOUT,double tol)

{
  pointer pCVar1;
  bool bVar2;
  uint iv;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    pCVar1 = (vertexOUT->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(vertexOUT->
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x18) <= uVar3)
    {
      std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
                (vertexOUT,vertex);
      return (int)(((long)(vertexOUT->
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(vertexOUT->
                         super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x18) + -1;
    }
    bVar2 = ChVector<double>::Equals(vertex,pCVar1 + uVar3,tol);
    if (bVar2) break;
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  return (int)uVar3;
}

Assistant:

int GetIndex(ChVector<double> vertex, std::vector<ChVector<double> >& vertexOUT, double tol) {
    // Suboptimal: search vertexes with same position and reuse, (in future: adopt hash map..)
    for (unsigned int iv = 0; iv < vertexOUT.size(); iv++) {
        if (vertex.Equals(vertexOUT[iv], tol)) {
            return iv;
        }
    }
    // not found, so add it to new vertexes
    vertexOUT.push_back(vertex);
    return ((int)vertexOUT.size() - 1);
}